

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O1

int add_cipher_oid(CBB *out,int nid)

{
  int unaff_EBP;
  long lVar1;
  bool bVar2;
  
  bVar2 = false;
  lVar1 = 0;
  do {
    if (*(int *)(kCipherOIDs[0].oid + lVar1 + 0xc) == nid) {
      unaff_EBP = CBB_add_asn1_element
                            (out,6,kCipherOIDs[0].oid + lVar1,(ulong)kCipherOIDs[0].oid[lVar1 + 9]);
      break;
    }
    lVar1 = lVar1 + 0x18;
    bVar2 = lVar1 == 0x78;
  } while (!bVar2);
  if (bVar2) {
    unaff_EBP = 0;
    ERR_put_error(0x13,0,0x7f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                  ,0x62);
  }
  return unaff_EBP;
}

Assistant:

static int add_cipher_oid(CBB *out, int nid) {
  for (const auto &cipher : kCipherOIDs) {
    if (cipher.nid == nid) {
      return CBB_add_asn1_element(out, CBS_ASN1_OBJECT, cipher.oid,
                                  cipher.oid_len);
    }
  }

  OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
  return 0;
}